

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O3

void ELFIO::dump::segment_data(ostream *out,Elf_Half no,segment *seg)

{
  undefined4 uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_01;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Segment # ",10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  iVar3 = (*seg->_vptr_segment[0x12])(seg);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    iVar4 = (*seg->_vptr_segment[0xd])(seg);
    if (CONCAT44(extraout_var_00,iVar4) != 0) {
      uVar8 = 0;
      do {
        if ((uVar8 & 0xf) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
          lVar6 = *(long *)out;
          *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 8;
          poVar5 = out + *(long *)(lVar6 + -0x18);
          if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar5);
            poVar5[0xe1] = (ostream)0x1;
            lVar6 = *(long *)out;
          }
          poVar5[0xe0] = (ostream)0x30;
          *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(out,"0x",2);
        lVar6 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = 2;
        poVar5 = out + *(long *)(lVar6 + -0x18);
        if (out[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar5);
          poVar5[0xe1] = (ostream)0x1;
          lVar6 = *(long *)out;
        }
        poVar5[0xe0] = (ostream)0x30;
        *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffff4f | 0x80;
        std::ostream::operator<<
                  ((ostream *)out,(uint)*(byte *)(CONCAT44(extraout_var,iVar3) + uVar8));
        cVar2 = (char)out;
        if ((int)(uVar8 & 0xf) == 0xf) {
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        uVar8 = uVar8 + 1;
        iVar4 = (*seg->_vptr_segment[0xd])(seg);
        uVar7 = CONCAT44(extraout_var_01,iVar4);
        if (0x3f < uVar7) {
          uVar7 = 0x40;
        }
      } while (uVar8 < uVar7);
      if ((uVar8 & 0xf) != 0) {
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
    }
    *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  }
  return;
}

Assistant:

static void
    segment_data( std::ostream& out, Elf_Half no, const segment* seg )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        out << "Segment # " << no << std::endl;
        const char* pdata = seg->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i;
            for ( i = 0; i < std::min( seg->get_file_size(), MAX_DATA_ENTRIES );
                  ++i ) {
                if ( i % 16 == 0 ) {
                    out << "[" << DUMP_HEX0x_FORMAT( 8 ) << i << "]";
                }

                out << " " << DUMP_HEX0x_FORMAT( 2 )
                    << ( pdata[i] & 0x000000FF );

                if ( i % 16 == 15 ) {
                    out << std::endl;
                }
            }
            if ( i % 16 != 0 ) {
                out << std::endl;
            }

            out.flags( original_flags );
        }

        return;
    }